

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O2

string * __thiscall
ws::Crypto::verify_url
          (string *__return_storage_ptr__,Crypto *this,string *msg_sign,string *time_stamp,
          string *nonce,string *echo_str)

{
  int iVar1;
  MsgCryptoError *this_00;
  string *in;
  string *inlen;
  allocator<char> local_41;
  string local_40;
  
  in = echo_str;
  inlen = echo_str;
  iVar1 = verify_sign(this,msg_sign,time_stamp,nonce,echo_str);
  if (iVar1 == 0) {
    decrypt((Crypto *)__return_storage_ptr__,(EVP_PKEY_CTX *)this,(uchar *)echo_str,(size_t *)nonce,
            (uchar *)in,(size_t)inlen);
    return __return_storage_ptr__;
  }
  this_00 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"verify sign failed.",&local_41);
  MsgCryptoError::MsgCryptoError(this_00,&local_40,(source_location)0x1957a8);
  __cxa_throw(this_00,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string verify_url(const std::string &msg_sign, const std::string &time_stamp,
                           const std::string &nonce, const std::string &echo_str)
    {
      if (verify_sign(msg_sign, time_stamp, nonce, echo_str) != 0)
      {
        throw MsgCryptoError("verify sign failed.");
      }
      return decrypt(echo_str);
    }